

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

int validate_signature(uchar *hash,rtr_signature_seg *sig,spki_record *record)

{
  int iVar1;
  EC_KEY *key;
  int iVar2;
  uint i;
  long lVar3;
  char *__s;
  long in_FS_OFFSET;
  EC_KEY *pub_key;
  char ski_str [61];
  EC_KEY *local_80;
  char local_78 [72];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = (EC_KEY *)0x0;
  iVar1 = load_public_key(&local_80,record->spki);
  key = local_80;
  if (iVar1 == 0) {
    iVar2 = 0;
    iVar1 = ECDSA_verify(0,hash,0x20,sig->signature,(uint)sig->sig_len,(EC_KEY *)local_80);
    if (iVar1 == 1) {
      lrtr_dbg("BGPSEC: Validation result of signature: valid");
      iVar2 = 1;
    }
    else if (iVar1 == 0) {
      lrtr_dbg("BGPSEC: Validation result of signature: invalid");
      iVar2 = 2;
    }
    else if (iVar1 == -1) {
      lrtr_dbg("BGPSEC: ERROR: Failed to verify EC Signature");
      iVar2 = -1;
    }
  }
  else {
    __s = local_78;
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    lVar3 = 0;
    do {
      sprintf(__s,"%02X ",(ulong)record->ski[lVar3]);
      lVar3 = lVar3 + 1;
      __s = __s + 3;
    } while (lVar3 != 0x14);
    lrtr_dbg("BGPSEC: WARNING: Invalid public key for SKI: %s",local_78);
    iVar2 = -1;
    key = local_80;
  }
  EC_KEY_free((EC_KEY *)key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int validate_signature(const unsigned char *hash, const struct rtr_signature_seg *sig, struct spki_record *record)
{
	int status = 0;
	enum rtr_bgpsec_rtvals retval;

	EC_KEY *pub_key = NULL;

	/* Load the contents of the spki buffer into the
	 * OpenSSL public key.
	 */
	retval = load_public_key(&pub_key, record->spki);

	if (retval != RTR_BGPSEC_SUCCESS) {
		/*The output string looks like this: "XX XX XX XX"*/
		/*where XX is a single byte. Including the spaces,*/
		/*we need to multiply by 3. The plus 1 is for the string*/
		/*terminator.*/
		char ski_str[(SKI_SIZE * 3) + 1] = {'\0'};

		ski_to_char(ski_str, record->ski);
		BGPSEC_DBG("WARNING: Invalid public key for SKI: %s", ski_str);
		retval = RTR_BGPSEC_ERROR;
		goto err;
	}

	/* The OpenSSL validation function to validate the signature. */
	status = ECDSA_verify(0, hash, SHA256_DIGEST_LENGTH, sig->signature, sig->sig_len, pub_key);

	switch (status) {
	case -1:
		BGPSEC_DBG1("ERROR: Failed to verify EC Signature");
		retval = RTR_BGPSEC_ERROR;
		break;
	case 0:
		BGPSEC_DBG1("Validation result of signature: invalid");
		retval = RTR_BGPSEC_NOT_VALID;
		break;
	case 1:
		BGPSEC_DBG1("Validation result of signature: valid");
		retval = RTR_BGPSEC_VALID;
		break;
	}

err:
	EC_KEY_free(pub_key);

	return retval;
}